

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_grad_fe.h
# Opt level: O3

vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
* __thiscall
lf::fe::MeshFunctionGradFE<double,_double>::operator()
          (vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *__return_storage_ptr__,MeshFunctionGradFE<double,_double> *this,Entity *e,
          MatrixXd *local)

{
  element_type *peVar1;
  MatrixXd *pMVar2;
  int iVar3;
  dim_t dVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  CoeffReturnType pdVar6;
  Scalar *pSVar7;
  undefined4 extraout_var_01;
  long lVar8;
  ulong blockCols;
  ulong uVar9;
  Matrix<double,_1,__1,_1,_1,__1> local_grads;
  Matrix<double,_1,__1,_1,_1,__1> local_dofs;
  Matrix<double,__1,__1,_0,__1,__1> grad_sf_eval;
  MatrixXd jac_t;
  assign_op<double,_double> local_1a9;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_1a8;
  PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_> local_198;
  MatrixXd *local_188;
  double local_180;
  Rhs local_178;
  Matrix<double,__1,__1,_0,__1,__1> local_160;
  Rhs local_148;
  Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false> local_110;
  Product<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>_>,_0>
  local_d8;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_68;
  
  peVar1 = (this->fe_space_).
           super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  iVar3 = (*peVar1->_vptr_ScalarFESpace[2])(peVar1,e);
  local_188 = local;
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x40))
            (&local_178,(long *)CONCAT44(extraout_var,iVar3),local);
  local_198.m_storage.m_data = (double *)0x0;
  local_198.m_storage.m_cols = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
            (&local_198,1,
             local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows);
  iVar3 = (*((this->fe_space_).
             super___shared_ptr<const_lf::fe::ScalarFESpace<double>,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ScalarFESpace[1])();
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x28))
                    ((long *)CONCAT44(extraout_var_00,iVar3),e);
  if (0 < local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_rows) {
    lVar8 = 0;
    do {
      pdVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                          &this->dof_vector_,*(Index *)(lVar5 + lVar8 * 8));
      local_180 = *pdVar6;
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_1> *)&local_198,
                          lVar8);
      *pSVar7 = local_180;
      lVar8 = lVar8 + 1;
    } while (lVar8 < local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows);
  }
  Eigen::
  Product<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>::
  Product((Product<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
           *)&local_d8,(Lhs *)&local_198,&local_178);
  pMVar2 = local_188;
  local_1a8.m_storage.m_data = (double *)0x0;
  local_1a8.m_storage.m_cols = 0;
  if (*(Index *)(local_d8.m_lhs.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                 .m_rows.m_value + 0x10) != 0) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>_>::resize
              (&local_1a8,1,
               *(Index *)(local_d8.m_lhs.
                          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                          .
                          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                          .
                          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                          .m_rows.m_value + 0x10));
  }
  Eigen::internal::
  generic_product_impl_base<Eigen::Matrix<double,1,-1,1,1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::internal::generic_product_impl<Eigen::Matrix<double,1,-1,1,1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,7>>
  ::evalTo<Eigen::Matrix<double,1,_1,1,1,_1>>
            ((Matrix<double,_1,__1,_1,_1,__1> *)&local_1a8,
             (Matrix<double,_1,__1,_1,_1,__1> *)
             local_d8.m_lhs.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_data,(Matrix<double,__1,__1,_0,__1,__1> *)
                     local_d8.m_lhs.
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
                     .m_rows.m_value);
  iVar3 = (*e->_vptr_Entity[3])(e);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar3) + 0x28))
            (&local_160,(long *)CONCAT44(extraout_var_01,iVar3),pMVar2);
  iVar3 = (*e->_vptr_Entity[4])(e);
  dVar4 = base::internal::DimensionImpl((RefElType)iVar3);
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::vector(__return_storage_ptr__,
           (pMVar2->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols,(allocator_type *)&local_d8);
  if ((__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->
      super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    blockCols = (ulong)dVar4;
    lVar5 = 0;
    lVar8 = 0;
    uVar9 = 0;
    do {
      Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                (&local_68,&local_160,0,lVar8,
                 local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows,blockCols);
      Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>::Block
                (&local_110,(Matrix<double,_1,__1,_1,_1,__1> *)&local_1a8,0,lVar8,1,blockCols);
      local_148.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
      m_outerStride =
           local_110.
           super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
           m_outerStride;
      local_148.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.m_startRow.
      m_value = local_110.
                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
                m_startRow.m_value;
      local_148.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.m_startCol.
      m_value = local_110.
                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
                m_startCol.m_value;
      local_148.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.m_cols.
      m_value = local_110.
                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
                .m_cols.m_value;
      local_148.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.m_xpr =
           local_110.
           super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.m_xpr;
      local_148.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.m_data =
           local_110.
           super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
           super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.
           m_data;
      local_148.m_matrix.
      super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>.m_rows.
      m_value = local_110.
                super_BlockImpl<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false,_true>.
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_1>
                .
                super_MapBase<Eigen::Block<Eigen::Matrix<double,_1,__1,_1,_1,__1>,__1,__1,_false>,_0>
                .m_rows.m_value;
      Eigen::
      Product<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_-1,_-1,_false>_>,_0>
      ::Product(&local_d8,&local_68,&local_148);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,1,_1,1,1,_1>,_1,_1,false>>,0>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 ((long)&(((__return_storage_ptr__->
                           super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data + lVar5),&local_d8,&local_1a9,(type)0x0);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + blockCols;
      lVar5 = lVar5 + 0x10;
    } while (uVar9 < (ulong)((long)(__return_storage_ptr__->
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(__return_storage_ptr__->
                                   super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  free(local_160.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  free(local_1a8.m_storage.m_data);
  free(local_198.m_storage.m_data);
  free(local_178.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Eigen::Matrix<Scalar, Eigen::Dynamic, 1>> operator()(
      const lf::mesh::Entity& e, const Eigen::MatrixXd& local) const {
    // Access information on local shape functions for the entity
    auto grad_sf_eval =
        fe_space_->ShapeFunctionLayout(e)->GradientsReferenceShapeFunctions(
            local);
    // Fetch the coefficients of the global shape functions associated with
    // the current mesh entity
    Eigen::Matrix<SCALAR_COEFF, 1, Eigen::Dynamic> local_dofs(
        1, grad_sf_eval.rows());
    auto global_dofs = fe_space_->LocGlobMap().GlobalDofIndices(e);
    for (Eigen::Index i = 0; i < grad_sf_eval.rows(); ++i) {
      local_dofs(i) = dof_vector_(global_dofs[i]);
    }
    // gradients w.r.t. reference element coordinates \hat{x}
    auto local_grads = (local_dofs * grad_sf_eval).eval();
    // Transform to Cartesian coordinates
    auto jac_t = e.Geometry()->JacobianInverseGramian(local);
    auto dim_local = base::narrow<Eigen::Index>(e.RefEl().Dimension());
    std::vector<Eigen::Matrix<Scalar, Eigen::Dynamic, 1>> result(local.cols());
    // Transform all the local gradients in the evaluation points
    for (Eigen::Index i = 0; i < result.size(); ++i) {
      result[i] = jac_t.block(0, dim_local * i, jac_t.rows(), dim_local) *
                  local_grads.block(0, i * dim_local, 1, dim_local).transpose();
    }
    return result;
  }